

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void remove_all_keys(int ssh_version)

{
  int iVar1;
  PageantKey *pk_00;
  PageantKey *pk;
  int end;
  int start;
  int ssh_version_local;
  
  iVar1 = find_first_key_for_version(ssh_version);
  pk._4_4_ = find_first_key_for_version(ssh_version + 1);
  while( true ) {
    if (pk._4_4_ <= iVar1) {
      return;
    }
    pk._4_4_ = pk._4_4_ + -1;
    pk_00 = (PageantKey *)delpos234(keytree,pk._4_4_);
    if ((pk_00->sort).ssh_version != ssh_version) break;
    pk_free(pk_00);
  }
  __assert_fail("pk->sort.ssh_version == ssh_version",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",0x114,
                "void remove_all_keys(int)");
}

Assistant:

static void remove_all_keys(int ssh_version)
{
    int start = find_first_key_for_version(ssh_version);
    int end = find_first_key_for_version(ssh_version + 1);
    while (end > start) {
        PageantKey *pk = delpos234(keytree, --end);
        assert(pk->sort.ssh_version == ssh_version);
        pk_free(pk);
    }
}